

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O2

size_t nh_base64_encode(uchar *src,size_t src_len,uchar *dest)

{
  uchar uVar1;
  uint uVar2;
  byte *pbVar3;
  uchar *puVar4;
  size_t sVar5;
  
  sVar5 = 0;
  if (src_len <= (src_len * 4) / 3 + 5) {
    pbVar3 = src + 2;
    puVar4 = dest;
    for (; 2 < (long)src_len; src_len = src_len - 3) {
      *puVar4 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[pbVar3[-2] >> 2];
      puVar4[1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                  [(uint)(pbVar3[-1] >> 4) | (pbVar3[-2] & 3) << 4];
      puVar4[2] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                  [(uint)(*pbVar3 >> 6) + (pbVar3[-1] & 0xf) * 4];
      puVar4[3] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[*pbVar3 & 0x3f]
      ;
      puVar4 = puVar4 + 4;
      pbVar3 = pbVar3 + 3;
    }
    if (src_len != 0) {
      *puVar4 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[pbVar3[-2] >> 2];
      uVar2 = (pbVar3[-2] & 3) << 4;
      if (src_len == 1) {
        puVar4[1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[uVar2];
        uVar1 = '=';
      }
      else {
        puVar4[1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                    [(byte)((byte)uVar2 | pbVar3[-1] >> 4)];
        uVar1 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                [(ulong)(pbVar3[-1] & 0xf) * 4];
      }
      puVar4[2] = uVar1;
      puVar4[3] = '=';
      puVar4 = puVar4 + 4;
    }
    *puVar4 = '\0';
    sVar5 = (long)puVar4 - (long)dest;
  }
  return sVar5;
}

Assistant:

size_t nh_base64_encode(const unsigned char *src, size_t src_len, unsigned char *dest) {
    // modified from http://web.mit.edu/freebsd/head/contrib/wpa/src/utils/base64.c
    size_t olen = src_len * 4 / 3 + 4; /* 3-byte blocks to 4-byte */
    olen++; /* nul termination */
    if (olen < src_len) return 0;

    unsigned char const *end = src + src_len;
    unsigned char const *in = src;
    unsigned char *pos = dest;
    while (end - in >= 3) {
        *pos++ = nh_base64_table[in[0] >> 2];
        *pos++ = nh_base64_table[((in[0] & 0x03) << 4) | (in[1] >> 4)];
        *pos++ = nh_base64_table[((in[1] & 0x0f) << 2) | (in[2] >> 6)];
        *pos++ = nh_base64_table[in[2] & 0x3f];
        in += 3;
    }

    if (end - in) {
        *pos++ = nh_base64_table[in[0] >> 2];
        if (end - in == 1) {
            *pos++ = nh_base64_table[(in[0] & 0x03) << 4];
            *pos++ = '=';
        } else {
            *pos++ = nh_base64_table[((in[0] & 0x03) << 4) | (in[1] >> 4)];
            *pos++ = nh_base64_table[(in[1] & 0x0f) << 2];
        }
        *pos++ = '=';
    }

    *pos = '\0';
    return pos - dest;
}